

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[60],int,char_const(&)[3],char_const*,char_const(&)[3]>
                   (string *__return_storage_ptr__,char (*a) [60],int *b,char (*args) [3],
                   char **args_1,char (*args_2) [3])

{
  char *__s;
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_e0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  size_t local_90;
  string *local_88;
  cmAlphaNum *local_80;
  size_t local_78;
  char (*local_70) [3];
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [3];
  undefined8 local_38;
  
  local_a8.first._M_len = strlen(*a);
  local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8.first._M_str = *a;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_e0,*b);
  pcVar1 = (cmAlphaNum *)(local_e0 + 0x10);
  if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_e0._0_8_;
  }
  local_88 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_e0;
  if ((cmAlphaNum *)local_e0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_e0._0_8_;
  }
  local_90 = (pcVar1->View_)._M_len;
  local_80 = (cmAlphaNum *)local_e0._0_8_;
  local_78 = strlen(*args);
  local_68 = 0;
  __s = *args_1;
  local_70 = args;
  local_60 = strlen(__s);
  local_50 = 0;
  local_58 = __s;
  local_48 = strlen(*args_2);
  local_38 = 0;
  views._M_len = 5;
  views._M_array = &local_a8;
  local_40 = args_2;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}